

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.c
# Opt level: O3

int fill_hostaddr(void *addr,char *hostname)

{
  in_addr_t iVar1;
  hostent *phVar2;
  
  phVar2 = gethostbyname(hostname);
  if (phVar2 == (hostent *)0x0) {
    iVar1 = inet_addr(hostname);
    if (iVar1 == 0xffffffff) {
      return 0;
    }
    *(in_addr_t *)addr = iVar1;
  }
  else {
    memcpy(addr,*phVar2->h_addr_list,(long)phVar2->h_length);
  }
  return 1;
}

Assistant:

static int
fill_hostaddr(void *addr, char *hostname)
{
    struct hostent *host_addr;
    
    host_addr = gethostbyname(hostname);
    if (host_addr == NULL) {
	int address;
	address = inet_addr(hostname);
	if (address == -1) {
	    /* 
	     *  not translatable as a hostname or 
	     * as a dot-style string IP address
	     */
	    return 0;
	}
	assert(sizeof(int) == sizeof(struct in_addr));
	*((int*)addr) = (int)address;
    } else {
	memcpy(addr, host_addr->h_addr, host_addr->h_length);
    }
    return 1;
}